

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O3

void oonf_viewer_print_help
               (autobuf *out,char *parameter,oonf_viewer_template *template,size_t count)

{
  int iVar1;
  abuf_template_data *paVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  abuf_template_data **ppaVar7;
  char **ppcVar8;
  
  if ((parameter != (char *)0x0) && (*parameter != '\0')) {
    if (count != 0) {
      ppaVar7 = &template->data;
      do {
        pcVar5 = (char *)ppaVar7[2];
        iVar1 = strcmp(parameter,pcVar5);
        if (iVar1 == 0) {
          if (ppaVar7[4] != (abuf_template_data *)0x0) {
            abuf_puts(out);
            pcVar5 = (char *)ppaVar7[2];
          }
          abuf_appendf(out,"The subcommand \'%s\' has the following keys:\n",pcVar5);
          uVar6 = (ulong)ppaVar7[1];
          if (uVar6 != 0) {
            paVar2 = *ppaVar7;
            uVar3 = 0;
            do {
              if (paVar2[uVar3].count != 0) {
                lVar4 = 0;
                uVar6 = 0;
                do {
                  abuf_appendf(out,"\t%%%s%%\n",
                               *(undefined8 *)((long)&(paVar2[uVar3].data)->key + lVar4));
                  uVar6 = uVar6 + 1;
                  paVar2 = *ppaVar7;
                  lVar4 = lVar4 + 0x18;
                } while (uVar6 < paVar2[uVar3].count);
                uVar6 = (ulong)ppaVar7[1];
              }
              uVar3 = uVar3 + 1;
            } while (uVar3 < uVar6);
          }
          pcVar5 = 
          "\nUse \'json\' as the first parameter \' to generate JSON output of all keys/value pairs.\nUse \'jsonraw\' as the first parameter to generate JSON output of all keys/value pairs  without isoprefixes for numbers.\nUse \'head\' as the first parameter to generate a headline for the table.\nUse \'raw\' as the first parameter to generate a headline for the table without isoprefixes for numbers.\nYou can also add a custom template (text with keys inside) as the last parameter instead.\n"
          ;
          goto LAB_00111e33;
        }
        ppaVar7 = ppaVar7 + 0xb;
        count = count - 1;
      } while (count != 0);
    }
    abuf_appendf(out,"Unknown subcommand %s\n",parameter);
    return;
  }
  abuf_puts(out,"Available subcommands:\n");
  if (count != 0) {
    ppcVar8 = &template->help_line;
    do {
      if (*ppcVar8 == (char *)0x0) {
        abuf_appendf(out,"\t%s\n",ppcVar8[-1]);
      }
      else {
        abuf_appendf(out,"\t%s: %s\n",ppcVar8[-1]);
      }
      ppcVar8 = ppcVar8 + 0xb;
      count = count - 1;
    } while (count != 0);
  }
  abuf_puts(out,
            "\nUse \'json\' as the first parameter \' to generate JSON output of all keys/value pairs.\nUse \'jsonraw\' as the first parameter to generate JSON output of all keys/value pairs  without isoprefixes for numbers.\nUse \'head\' as the first parameter to generate a headline for the table.\nUse \'raw\' as the first parameter to generate a headline for the table without isoprefixes for numbers.\nYou can also add a custom template (text with keys inside) as the last parameter instead.\n"
           );
  pcVar5 = "Use \'help <command> <subcommand>\' to get help about a subcommand\n";
LAB_00111e33:
  abuf_puts(out,pcVar5);
  return;
}

Assistant:

void
oonf_viewer_print_help(
  struct autobuf *out, const char *parameter, struct oonf_viewer_template *template, size_t count) {
  size_t i, j, k;

  if (parameter == NULL || *parameter == 0) {
    abuf_puts(out, "Available subcommands:\n");

    for (i = 0; i < count; i++) {
      if (template[i].help_line) {
        abuf_appendf(out, "\t%s: %s\n", template[i].json_name, template[i].help_line);
      }
      else {
        abuf_appendf(out, "\t%s\n", template[i].json_name);
      }
    }

    abuf_puts(out, _telnet_help);
    abuf_puts(out, "Use 'help <command> <subcommand>' to get help about a subcommand\n");
    return;
  }
  for (i = 0; i < count; i++) {
    if (strcmp(parameter, template[i].json_name) == 0) {
      if (template[i].help) {
        abuf_puts(out, template[i].help);
      }
      abuf_appendf(out, "The subcommand '%s' has the following keys:\n", template[i].json_name);

      for (j = 0; j < template[i].data_size; j++) {
        for (k = 0; k < template[i].data[j].count; k++) {
          abuf_appendf(out, "\t%%%s%%\n", template[i].data[j].data[k].key);
        }
      }

      abuf_puts(out, _telnet_help);
      return;
    }
  }

  abuf_appendf(out, "Unknown subcommand %s\n", parameter);
}